

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FloatPtexTexture *
pbrt::FloatPtexTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  FloatPtexTexture *pFVar1;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Float FVar2;
  Float scale;
  ColorEncoding encoding;
  string encodingString;
  string filename;
  string *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  polymorphic_allocator<std::byte> *this;
  allocator<char> *in_stack_fffffffffffffe70;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe78;
  allocator<char> *__s;
  undefined1 local_169 [37];
  Float local_144;
  Allocator in_stack_fffffffffffffec8;
  undefined8 local_129;
  allocator<char> local_101;
  string local_100 [32];
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  allocator<char> local_b9;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *local_8;
  
  local_18 = in_RSI;
  local_8 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  __s = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,in_stack_fffffffffffffe70);
  TextureParameterDictionary::GetOneString
            ((TextureParameterDictionary *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),in_stack_fffffffffffffe40
             ,in_stack_fffffffffffffe38);
  ResolveFilename(in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  __a = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,__a);
  this = (polymorphic_allocator<std::byte> *)&local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,__a);
  TextureParameterDictionary::GetOneString
            ((TextureParameterDictionary *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),in_stack_fffffffffffffe40
             ,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string((string *)((long)&local_129 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  ColorEncoding::Get(local_8,in_stack_fffffffffffffec8);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_169;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,__a);
  FVar2 = TextureParameterDictionary::GetOneFloat
                    ((TextureParameterDictionary *)in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe38,0.0);
  std::__cxx11::string::~string((string *)(local_169 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_169);
  local_144 = FVar2;
  pFVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::FloatPtexTexture,std::__cxx11::string&,pbrt::ColorEncoding&,float&>
                     (this,args,(ColorEncoding *)local_18,
                      (float *)CONCAT44(FVar2,in_stack_fffffffffffffe48));
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_40);
  return pFVar1;
}

Assistant:

FloatPtexTexture *FloatPtexTexture::Create(const Transform &renderFromTexture,
                                           const TextureParameterDictionary &parameters,
                                           const FileLoc *loc, Allocator alloc) {
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    std::string encodingString = parameters.GetOneString("encoding", "gamma 2.2");
    ColorEncoding encoding = ColorEncoding::Get(encodingString, alloc);
    Float scale = parameters.GetOneFloat("scale", 1.f);
    return alloc.new_object<FloatPtexTexture>(filename, encoding, scale);
}